

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O2

int xerror_handler(Display *d,XErrorEvent *e)

{
  char buf2 [128];
  char buf1 [128];
  undefined1 auStack_128 [128];
  char local_a8 [136];
  
  sprintf(local_a8,"XRequest.%d",(ulong)e->request_code);
  XGetErrorDatabaseText(d,"",local_a8,local_a8,auStack_128,0x80);
  XGetErrorText(d,e->error_code,local_a8,0x80);
  (*Fl::warning)("%s: %s 0x%lx",auStack_128,local_a8,e->resourceid);
  return 0;
}

Assistant:

static int xerror_handler(Display* d, XErrorEvent* e) {
    char buf1[128], buf2[128];
    sprintf(buf1, "XRequest.%d", e->request_code);
    XGetErrorDatabaseText(d,"",buf1,buf1,buf2,128);
    XGetErrorText(d, e->error_code, buf1, 128);
    Fl::warning("%s: %s 0x%lx", buf2, buf1, e->resourceid);
    return 0;
  }